

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void vu_dialog(t_vu *x,t_symbol *s,int argc,t_atom *argv)

{
  t_iem_fstyle_flags *ptVar1;
  t_iem_init_symargs *ptVar2;
  _glist *canvas;
  int iVar3;
  t_symbol *s_00;
  t_atomtype tVar4;
  t_float tVar5;
  t_float tVar6;
  t_float tVar7;
  t_floatarg fscale;
  t_symbol *srl [3];
  t_atom undo [18];
  
  tVar5 = atom_getfloatarg(0,argc,argv);
  tVar4 = A_FLOAT;
  tVar6 = atom_getfloatarg(1,argc,argv);
  tVar7 = atom_getfloatarg(4,argc,argv);
  iemgui_setdialogatoms(&x->x_gui,0x12,undo);
  undo[2].a_w.w_index = 0x3c23d70a;
  undo[3].a_w.w_index = 0x3f800000;
  undo[4].a_w._0_4_ = (undefined4)x->x_scale;
  undo[5].a_w.w_index = -0x40800000;
  undo[0xf].a_type = A_SYMBOL;
  undo[2].a_type = tVar4;
  undo[3].a_type = tVar4;
  undo[4].a_type = tVar4;
  undo[5].a_type = tVar4;
  undo[0xf].a_w.w_symbol = gensym("none");
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,undo,argc,argv);
  iemgui_dialog(&x->x_gui,srl,argc,argv);
  ptVar1 = &(x->x_gui).x_fsf;
  *(byte *)ptVar1 = *(byte *)ptVar1 & 0x7f;
  ptVar2 = &(x->x_gui).x_isa;
  *(byte *)ptVar2 = *(byte *)ptVar2 & 0xfe;
  iVar3 = iemgui_clip_size((int)tVar5);
  (x->x_gui).x_w = iVar3 * ((x->x_gui).x_glist)->gl_zoom;
  vu_check_height(x,(int)tVar6);
  if ((int)tVar7 == 0) {
    fscale = 0.0;
  }
  else {
    fscale = 1.0;
  }
  vu_scale(x,fscale);
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void vu_dialog(t_vu *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int w = (int)atom_getfloatarg(0, argc, argv);
    int h = (int)atom_getfloatarg(1, argc, argv);
    int scale = (int)atom_getfloatarg(4, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+2, 0.01);
    SETFLOAT(undo+3, 1);
    SETFLOAT(undo+4, x->x_scale);
    SETFLOAT(undo+5, -1);
    SETSYMBOL(undo+15, gensym("none"));
    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_fsf.x_snd_able = 0;
    x->x_gui.x_isa.x_loadinit = 0;
    x->x_gui.x_w = iemgui_clip_size(w) * IEMGUI_ZOOM(x);
    vu_check_height(x, h);
    if(scale != 0)
        scale = 1;
    vu_scale(x, (t_float)scale);
    iemgui_size(x, &x->x_gui);
}